

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFile.cpp
# Opt level: O1

ssize_t __thiscall blc::tools::VFile::write(VFile *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  exception *peVar2;
  undefined4 in_register_00000034;
  string local_60;
  string local_40;
  
  if (this->_isClosed != false) {
    peVar2 = (exception *)__cxa_allocate_exception(0x78);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Attempt to write on a closed virtual file","");
    error::exception::exception(peVar2,&local_60);
    __cxa_throw(peVar2,&error::exception::typeinfo,error::exception::~exception);
  }
  if ((ulong)(long)this->_cursor <= (this->_cache)._M_string_length) {
    std::__cxx11::string::replace
              ((ulong)&this->_cache,(long)this->_cursor,(char *)0x0,
               *(ulong *)CONCAT44(in_register_00000034,__fd));
    uVar1 = (uint)((ulong *)CONCAT44(in_register_00000034,__fd))[1];
    this->_cursor = this->_cursor + uVar1;
    return (ulong)uVar1;
  }
  peVar2 = (exception *)__cxa_allocate_exception(0x78);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Cursor exeeds the size of file","");
  error::exception::exception(peVar2,&local_40);
  __cxa_throw(peVar2,&error::exception::typeinfo,error::exception::~exception);
}

Assistant:

void blc::tools::VFile::write(const std::string &str) const {
	if (!this->_isClosed) {
		if (this->_cursor <= this->_cache.size()) {
			( const_cast <VFile*> (this) )->_cache.insert(this->_cursor, str);
			( const_cast <VFile*> (this) )->_cursor += str.size();
		} else {
			throw blc::error::exception("Cursor exeeds the size of file");
		}
	} else {
		throw blc::error::exception("Attempt to write on a closed virtual file");
	}
}